

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
tinyusdz::crate::CrateReader::GetPathString_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,CrateReader *this,Index index)

{
  size_type *psVar1;
  pointer pPVar2;
  ulong uVar3;
  ulong uVar4;
  string local_30;
  
  uVar3 = (ulong)index.value;
  pPVar2 = (this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pPVar2 >> 4) * 0x4ec4ec4ec4ec4ec5
  ;
  if (uVar4 < uVar3 || uVar4 - uVar3 == 0) {
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
  }
  else {
    Path::full_path_name_abi_cxx11_(&local_30,pPVar2 + uVar3);
    __return_storage_ptr__->has_value_ = true;
    psVar1 = (size_type *)((long)&__return_storage_ptr__->contained + 0x10);
    *(size_type **)&__return_storage_ptr__->contained = psVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p == &local_30.field_2) {
      *psVar1 = local_30.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = local_30.field_2._8_8_;
    }
    else {
      *(pointer *)&__return_storage_ptr__->contained = local_30._M_dataplus._M_p;
      *(size_type *)((long)&__return_storage_ptr__->contained + 0x10) =
           local_30.field_2._M_allocated_capacity;
    }
    *(size_type *)((long)&__return_storage_ptr__->contained + 8) = local_30._M_string_length;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<std::string> CrateReader::GetPathString(
    crate::Index index) const {
  if (index.value < _paths.size()) {
    // ok
  } else {
    return nonstd::nullopt;
  }

  const Path &p = _paths[index.value];

  return p.full_path_name();
}